

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLIsNvScreen(Display *dpy,int screen)

{
  int iVar1;
  undefined1 *puVar2;
  undefined4 in_ESI;
  long in_RDI;
  int isnv;
  xnvCtrlIsNvReq *req;
  xnvCtrlIsNvReply rep;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffffa8;
  undefined1 local_40 [8];
  int local_38;
  XExtDisplayInfo *local_20;
  undefined4 local_14;
  long local_10;
  int local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_20 = find_display(in_stack_ffffffffffffffa8);
  if ((local_20 == (XExtDisplayInfo *)0x0) || (local_20->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else if ((local_20 == (XExtDisplayInfo *)0x0) || (local_20->codes == (XExtCodes *)0x0)) {
    XMissingExtension(local_10,nvctrl_extension_name);
    local_4 = 0;
  }
  else {
    if (*(long *)(local_10 + 0x968) != 0) {
      (*(code *)**(undefined8 **)(local_10 + 0x968))(local_10);
    }
    puVar2 = (undefined1 *)_XGetRequest(local_10,1,8);
    *puVar2 = (char)local_20->codes->major_opcode;
    puVar2[1] = 1;
    *(undefined4 *)(puVar2 + 4) = local_14;
    iVar1 = _XReply(local_10,local_40,0,1);
    if (iVar1 == 0) {
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = 0;
    }
    else {
      if (*(long *)(local_10 + 0x968) != 0) {
        (**(code **)(*(long *)(local_10 + 0x968) + 8))(local_10);
      }
      if (*(long *)(local_10 + 0xd0) != 0) {
        (**(code **)(local_10 + 0xd0))(local_10);
      }
      local_4 = local_38;
    }
  }
  return local_4;
}

Assistant:

Bool XNVCTRLIsNvScreen (
    Display *dpy,
    int screen
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlIsNvReply rep;
    xnvCtrlIsNvReq   *req;
    Bool isnv;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlIsNv, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlIsNv;
    req->screen = screen;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    isnv = rep.isnv;
    UnlockDisplay (dpy);
    SyncHandle ();
    return isnv;
}